

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O2

connection __thiscall
obs::signal<void_(int)>::connect<A>(signal<void_(int)> *this,offset_in_A_to_subr m,A *t)

{
  slot_type *s;
  connection cVar1;
  undefined1 local_40 [24];
  
  s = (slot_type *)operator_new(0x28);
  local_40._8_8_ = m;
  local_40._16_8_ = t;
  slot<void(int)>::
  slot<obs::signal<void(int)>::connect<A>(void(A::*)(int),A*)::_lambda(int)_1_,void>
            ((slot<void(int)> *)s,(anon_class_24_2_94732062 *)local_40);
  cVar1 = add_slot(this,s);
  return cVar1;
}

Assistant:

connection connect(void (Class::*m)(Args...args), Class* t) {
    return add_slot(new slot_type(
                      [=](Args...args) {
                        (t->*m)(std::forward<Args>(args)...);
                      }));
  }